

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O0

AddSocketOptionFunc *
brynet::net::TcpService::AddSocketOption::WithDataCallback
          (AddSocketOptionFunc *__return_storage_ptr__,DATA_CALLBACK *callback)

{
  function<unsigned_long_(long,_const_char_*,_unsigned_long)> local_38;
  DATA_CALLBACK *local_18;
  DATA_CALLBACK *callback_local;
  
  local_18 = callback;
  callback_local = (DATA_CALLBACK *)__return_storage_ptr__;
  std::function<unsigned_long_(long,_const_char_*,_unsigned_long)>::function(&local_38,callback);
  std::function<void(brynet::net::TcpService::AddSocketOption::Options&)>::
  function<brynet::net::TcpService::AddSocketOption::WithDataCallback(std::function<unsigned_long(long,char_const*,unsigned_long)>)::__0,void>
            ((function<void(brynet::net::TcpService::AddSocketOption::Options&)> *)
             __return_storage_ptr__,(anon_class_32_1_dda845c3 *)&local_38);
  WithDataCallback(std::function<unsigned_long(long,char_const*,unsigned_long)>)::$_0::~__0
            ((__0 *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

TcpService::AddSocketOption::AddSocketOptionFunc TcpService::AddSocketOption::WithDataCallback(TcpService::DATA_CALLBACK callback)
{
    return [=](TcpService::AddSocketOption::Options& option) {
        option.dataCallback = callback;
    };
}